

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blitter.cpp
# Opt level: O0

void __thiscall Amiga::Blitter<false>::set_data(Blitter<false> *this,int channel,uint16_t value)

{
  LogLine local_20;
  ushort local_16;
  uint local_14;
  uint16_t value_local;
  Blitter<false> *pBStack_10;
  int channel_local;
  Blitter<false> *this_local;
  
  local_16 = value;
  local_14 = channel;
  pBStack_10 = this;
  Log::Logger<(Log::Source)6>::info((Logger<(Log::Source)6> *)&local_20);
  Log::Logger<(Log::Source)6>::LogLine::append
            (&local_20,"Set data %d to %04x",(ulong)local_14,(ulong)local_16);
  Log::Logger<(Log::Source)6>::LogLine::~LogLine(&local_20);
  if (local_14 == 0) {
    this->a_data_ = local_16;
  }
  else if (local_14 == 1) {
    this->b_data_ = local_16;
  }
  else if (local_14 == 2) {
    this->c_data_ = local_16;
  }
  return;
}

Assistant:

void Blitter<record_bus>::set_data(int channel, uint16_t value) {
	logger.info().append("Set data %d to %04x", channel, value);

	// Ugh, backed myself into a corner. TODO: clean.
	switch(channel) {
		case 0: a_data_ = value; break;
		case 1: b_data_ = value; break;
		case 2: c_data_ = value; break;
		default: break;
	}
}